

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O3

void http_request_cb(evhttp_request *req,void *arg)

{
  string_view source_file;
  pointer pCVar1;
  pointer pHVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  uint uVar5;
  RequestMethod RVar6;
  int iVar7;
  long lVar8;
  HTTPRequest *pHVar9;
  Logger *pLVar10;
  char *pcVar11;
  HTTPWorkItem *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  undefined8 __pos;
  CSubNet *subnet;
  pointer this_00;
  pointer pHVar12;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  span<const_std::byte,_18446744073709551615UL> reply;
  string_view str;
  string_view str_00;
  string_view logging_function_02;
  string strURI;
  UniqueLock<GlobalMutex> criticalblock12;
  string path;
  char *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  HTTPRequest *local_1b0 [2];
  string local_1a0;
  long *local_180;
  size_t local_178;
  long local_170 [2];
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  direct_or_indirect local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [5];
  unique_lock<std::mutex> local_98 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = evhttp_request_get_connection();
  HTTPRequestTracker::AddRequest(&g_requests,req);
  evhttp_request_set_on_complete_cb(req,http_request_cb::anon_class_1_0_00000001::__invoke,0);
  evhttp_connection_set_closecb(lVar8,http_request_cb::anon_class_1_0_00000001::__invoke,0);
  uVar5 = event_get_version_number();
  if (((0x20105ff < uVar5) && (uVar5 = event_get_version_number(), lVar8 != 0 && uVar5 < 0x2010900))
     && (lVar8 = evhttp_connection_get_bufferevent(lVar8), lVar8 != 0)) {
    bufferevent_disable(lVar8,2);
  }
  pHVar9 = (HTTPRequest *)operator_new(0x18);
  HTTPRequest::HTTPRequest(pHVar9,req,(SignalInterrupt *)arg,false);
  HTTPRequest::GetPeer((CService *)&local_100.indirect_contents,pHVar9);
  bVar4 = CNetAddr::IsValid((CNetAddr *)&local_100.indirect_contents);
  pCVar1 = rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((bVar4) &&
     (rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
      super__Vector_impl_data._M_start !=
      rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    this_00 = rpc_allow_subnets.super__Vector_base<CSubNet,_std::allocator<CSubNet>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      bVar4 = CSubNet::Match(this_00,(CNetAddr *)&local_100.indirect_contents);
      this_00 = this_00 + 1;
    } while (this_00 != pCVar1 && !bVar4);
  }
  else {
    bVar4 = false;
  }
  if (0x10 < (uint)local_f0[0]._0_4_) {
    free(local_100.indirect_contents.indirect);
  }
  if (bVar4 == false) {
    pLVar10 = LogInstance();
    bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar10,HTTP,Debug);
    iVar7 = 0x193;
    if (bVar4) {
      HTTPRequest::GetPeer((CService *)&local_100.indirect_contents,pHVar9);
      CService::ToStringAddrPort_abi_cxx11_(&local_58,(CService *)&local_100.indirect_contents);
      logging_function._M_str = "http_request_cb";
      logging_function._M_len = 0xf;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
      ;
      source_file_00._M_len = 0x57;
      LogPrintf_<std::__cxx11::string>
                (logging_function,source_file_00,0x123,
                 IPC|COINDB|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|ZMQ|BENCH|MEMPOOL
                 |NET,(Level)&local_58,in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
      iVar7 = 0x193;
LAB_00475998:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      if (0x10 < (uint)local_f0[0]._0_4_) {
        free(local_100.indirect_contents.indirect);
      }
    }
LAB_004759d0:
    HTTPRequest::WriteReply
              (pHVar9,iVar7,(span<const_std::byte,_18446744073709551615UL>)ZEXT816(0x896a96));
  }
  else {
    RVar6 = HTTPRequest::GetRequestMethod(pHVar9);
    if (RVar6 == UNKNOWN) {
      pLVar10 = LogInstance();
      bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar10,HTTP,Debug);
      iVar7 = 0x195;
      if (bVar4) {
        HTTPRequest::GetPeer((CService *)&local_100.indirect_contents,pHVar9);
        CService::ToStringAddrPort_abi_cxx11_(&local_58,(CService *)&local_100.indirect_contents);
        logging_function_00._M_str = "http_request_cb";
        logging_function_00._M_len = 0xf;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
        ;
        source_file_01._M_len = 0x57;
        LogPrintf_<std::__cxx11::string>
                  (logging_function_00,source_file_01,299,
                   IPC|COINDB|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|WALLETDB|ZMQ|
                   BENCH|HTTP|MEMPOOL|TOR,(Level)&local_58,in_stack_fffffffffffffe30,
                   in_stack_fffffffffffffe38);
        iVar7 = 0x195;
        goto LAB_00475998;
      }
      goto LAB_004759d0;
    }
    pLVar10 = LogInstance();
    bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar10,HTTP,Debug);
    if (bVar4) {
      RVar6 = HTTPRequest::GetRequestMethod(pHVar9);
      RequestMethodString_abi_cxx11_(&local_120,RVar6);
      pcVar11 = (char *)evhttp_request_get_uri(pHVar9->req);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,pcVar11,(allocator<char> *)&local_100.indirect_contents);
      str._M_str = (char *)local_180;
      str._M_len = local_178;
      SanitizeString_abi_cxx11_(&local_160,str,3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_140,&local_160,0,100);
      HTTPRequest::GetPeer((CService *)&local_100.indirect_contents,pHVar9);
      CService::ToStringAddrPort_abi_cxx11_(&local_1a0,(CService *)&local_100.indirect_contents);
      pLVar10 = LogInstance();
      bVar4 = BCLog::Logger::Enabled(pLVar10);
      if (bVar4) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_78,(tinyformat *)"Received a %s request for %s from %s\n",
                   (char *)&local_120,&local_140,&local_1a0,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pLVar10 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x57;
        local_78._M_string_length = 0x8419c9;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
        ;
        source_file._M_len = 0x57;
        str_00._M_str = local_58._M_dataplus._M_p;
        str_00._M_len = local_58._M_string_length;
        logging_function_02._M_str = "http_request_cb";
        logging_function_02._M_len = 0xf;
        BCLog::Logger::LogPrintStr(pLVar10,str_00,logging_function_02,source_file,0x131,HTTP,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if (0x10 < (uint)local_f0[0]._0_4_) {
        free(local_100.indirect_contents.indirect);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if (local_180 != local_170) {
        operator_delete(local_180,local_170[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar11 = (char *)evhttp_request_get_uri(pHVar9->req);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100.indirect_contents,pcVar11,(allocator<char> *)&local_58);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_98[0]._M_device = (mutex_type *)&g_httppathhandlers_mutex;
    local_98[0]._M_owns = false;
    std::unique_lock<std::mutex>::lock(local_98);
    pHVar2 = pathHandlers.super__Vector_base<HTTPPathHandler,_std::allocator<HTTPPathHandler>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pathHandlers.super__Vector_base<HTTPPathHandler,_std::allocator<HTTPPathHandler>_>._M_impl.
        super__Vector_impl_data._M_start !=
        pathHandlers.super__Vector_base<HTTPPathHandler,_std::allocator<HTTPPathHandler>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pHVar12 = pathHandlers.super__Vector_base<HTTPPathHandler,_std::allocator<HTTPPathHandler>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        __pos = local_100._8_8_;
        if (pHVar12->exactMatch == true) {
          if (local_100._8_8_ == (pHVar12->prefix)._M_string_length) {
            if (local_100._8_8_ == 0) {
              __pos = 0;
            }
            else {
              iVar7 = bcmp(local_100.indirect_contents.indirect,(pHVar12->prefix)._M_dataplus._M_p,
                           local_100._8_8_);
              if (iVar7 != 0) goto LAB_00475819;
            }
LAB_00475b30:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_100.indirect_contents,__pos,0xffffffffffffffff);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_58,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            this = (HTTPWorkItem *)operator_new(0x50);
            local_1b0[0] = pHVar9;
            HTTPWorkItem::HTTPWorkItem
                      (this,(unique_ptr<HTTPRequest,_std::default_delete<HTTPRequest>_>)local_1b0,
                       &local_58,&pHVar12->handler);
            pHVar9 = local_1b0[0];
            local_78._M_dataplus._M_p = (pointer)this;
            if (local_1b0[0] != (HTTPRequest *)0x0) {
              HTTPRequest::~HTTPRequest(local_1b0[0]);
              operator_delete(pHVar9,0x18);
            }
            local_1b0[0] = (HTTPRequest *)0x0;
            if ((__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                 )g_work_queue._M_t.
                  super___uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_WorkQueue<HTTPClosure>_*,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                  .super__Head_base<0UL,_WorkQueue<HTTPClosure>_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                 )0x0) {
              __assert_fail("g_work_queue",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
                            ,0x148,"void http_request_cb(struct evhttp_request *, void *)");
            }
            bVar4 = WorkQueue<HTTPClosure>::Enqueue
                              ((WorkQueue<HTTPClosure> *)
                               g_work_queue._M_t.
                               super___uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_WorkQueue<HTTPClosure>_*,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                               .super__Head_base<0UL,_WorkQueue<HTTPClosure>_*,_false>._M_head_impl,
                               (HTTPClosure *)this);
            if (!bVar4) {
              logging_function_01._M_str = "http_request_cb";
              logging_function_01._M_len = 0xf;
              source_file_02._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
              ;
              source_file_02._M_len = 0x57;
              LogPrintf_<>(logging_function_01,source_file_02,0x14c,ALL,Info,
                           "WARNING: request rejected because http work queue depth exceeded, it can be increased with the -rpcworkqueue= setting\n"
                          );
              reply._M_extent._M_extent_value = 0x19;
              reply._M_ptr = (pointer)"Work queue depth exceeded";
              HTTPRequest::WriteReply
                        ((((unique_ptr<HTTPRequest,_std::default_delete<HTTPRequest>_> *)
                          (local_78._M_dataplus._M_p + 8))->_M_t).
                         super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
                         super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
                         super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl,0x1f7,reply);
              if ((HTTPWorkItem *)local_78._M_dataplus._M_p != (HTTPWorkItem *)0x0) {
                std::default_delete<HTTPWorkItem>::operator()
                          ((default_delete<HTTPWorkItem> *)&local_78,
                           (HTTPWorkItem *)local_78._M_dataplus._M_p);
              }
            }
            pHVar9 = (HTTPRequest *)0x0;
            goto LAB_00475841;
          }
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_100.indirect_contents,0,(pHVar12->prefix)._M_string_length);
          _Var3._M_p = local_78._M_dataplus._M_p;
          if ((char *)local_78._M_string_length == (char *)(pHVar12->prefix)._M_string_length) {
            if ((char *)local_78._M_string_length == (char *)0x0) {
              bVar4 = true;
            }
            else {
              iVar7 = bcmp(local_78._M_dataplus._M_p,(pHVar12->prefix)._M_dataplus._M_p,
                           local_78._M_string_length);
              bVar4 = iVar7 == 0;
            }
          }
          else {
            bVar4 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != &local_78.field_2) {
            operator_delete(_Var3._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (bVar4) {
            __pos = (pHVar12->prefix)._M_string_length;
            goto LAB_00475b30;
          }
        }
LAB_00475819:
        pHVar12 = pHVar12 + 1;
      } while (pHVar12 != pHVar2);
    }
    HTTPRequest::WriteReply
              (pHVar9,0x194,(span<const_std::byte,_18446744073709551615UL>)ZEXT816(0x896a96));
LAB_00475841:
    std::unique_lock<std::mutex>::~unique_lock(local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.indirect_contents.indirect != local_f0) {
      operator_delete(local_100.indirect_contents.indirect,
                      CONCAT44(local_f0[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_f0[0]._M_allocated_capacity) + 1);
    }
    if (pHVar9 == (HTTPRequest *)0x0) goto LAB_004759f8;
  }
  HTTPRequest::~HTTPRequest(pHVar9);
  operator_delete(pHVar9,0x18);
LAB_004759f8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void http_request_cb(struct evhttp_request* req, void* arg)
{
    evhttp_connection* conn{evhttp_request_get_connection(req)};
    // Track active requests
    {
        g_requests.AddRequest(req);
        evhttp_request_set_on_complete_cb(req, [](struct evhttp_request* req, void*) {
            g_requests.RemoveRequest(req);
        }, nullptr);
        evhttp_connection_set_closecb(conn, [](evhttp_connection* conn, void* arg) {
            g_requests.RemoveConnection(conn);
        }, nullptr);
    }

    // Disable reading to work around a libevent bug, fixed in 2.1.9
    // See https://github.com/libevent/libevent/commit/5ff8eb26371c4dc56f384b2de35bea2d87814779
    // and https://github.com/bitcoin/bitcoin/pull/11593.
    if (event_get_version_number() >= 0x02010600 && event_get_version_number() < 0x02010900) {
        if (conn) {
            bufferevent* bev = evhttp_connection_get_bufferevent(conn);
            if (bev) {
                bufferevent_disable(bev, EV_READ);
            }
        }
    }
    auto hreq{std::make_unique<HTTPRequest>(req, *static_cast<const util::SignalInterrupt*>(arg))};

    // Early address-based allow check
    if (!ClientAllowed(hreq->GetPeer())) {
        LogDebug(BCLog::HTTP, "HTTP request from %s rejected: Client network is not allowed RPC access\n",
                 hreq->GetPeer().ToStringAddrPort());
        hreq->WriteReply(HTTP_FORBIDDEN);
        return;
    }

    // Early reject unknown HTTP methods
    if (hreq->GetRequestMethod() == HTTPRequest::UNKNOWN) {
        LogDebug(BCLog::HTTP, "HTTP request from %s rejected: Unknown HTTP request method\n",
                 hreq->GetPeer().ToStringAddrPort());
        hreq->WriteReply(HTTP_BAD_METHOD);
        return;
    }

    LogDebug(BCLog::HTTP, "Received a %s request for %s from %s\n",
             RequestMethodString(hreq->GetRequestMethod()), SanitizeString(hreq->GetURI(), SAFE_CHARS_URI).substr(0, 100), hreq->GetPeer().ToStringAddrPort());

    // Find registered handler for prefix
    std::string strURI = hreq->GetURI();
    std::string path;
    LOCK(g_httppathhandlers_mutex);
    std::vector<HTTPPathHandler>::const_iterator i = pathHandlers.begin();
    std::vector<HTTPPathHandler>::const_iterator iend = pathHandlers.end();
    for (; i != iend; ++i) {
        bool match = false;
        if (i->exactMatch)
            match = (strURI == i->prefix);
        else
            match = (strURI.substr(0, i->prefix.size()) == i->prefix);
        if (match) {
            path = strURI.substr(i->prefix.size());
            break;
        }
    }

    // Dispatch to worker thread
    if (i != iend) {
        std::unique_ptr<HTTPWorkItem> item(new HTTPWorkItem(std::move(hreq), path, i->handler));
        assert(g_work_queue);
        if (g_work_queue->Enqueue(item.get())) {
            item.release(); /* if true, queue took ownership */
        } else {
            LogPrintf("WARNING: request rejected because http work queue depth exceeded, it can be increased with the -rpcworkqueue= setting\n");
            item->req->WriteReply(HTTP_SERVICE_UNAVAILABLE, "Work queue depth exceeded");
        }
    } else {
        hreq->WriteReply(HTTP_NOT_FOUND);
    }
}